

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O2

char * Abc_ConvertBddToSop(Mem_Flex_t *pMan,DdManager *dd,DdNode *bFuncOn,DdNode *bFuncOnDc,
                          int nFanins,int fAllPrimes,Vec_Str_t *vCube,int fMode)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  DdNode *pDVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  DdNode *zCover;
  DdNode *zCover0;
  DdNode *zCover1;
  
  if ((bFuncOn != bFuncOnDc) && (iVar1 = Cudd_bddLeq(dd,bFuncOn,bFuncOnDc), iVar1 == 0)) {
    __assert_fail("bFuncOn == bFuncOnDc || Cudd_bddLeq( dd, bFuncOn, bFuncOnDc )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0xdd,
                  "char *Abc_ConvertBddToSop(Mem_Flex_t *, DdManager *, DdNode *, DdNode *, int, int, Vec_Str_t *, int)"
                 );
  }
  if ((*(int *)((ulong)bFuncOn & 0xfffffffffffffffe) == 0x7fffffff) ||
     (*(int *)((ulong)bFuncOnDc & 0xfffffffffffffffe) == 0x7fffffff)) {
    if (pMan == (Mem_Flex_t *)0x0) {
      pcVar3 = (char *)malloc((long)(nFanins + 4));
    }
    else {
      pcVar3 = Mem_FlexEntryFetch(pMan,nFanins + 4);
    }
    *pcVar3 = ' ';
    pDVar4 = Cudd_ReadOne(dd);
    pcVar3[1] = pDVar4 == bFuncOn | 0x30;
    pcVar3[2] = '\n';
    pcVar3[3] = '\0';
    return pcVar3;
  }
  if (fMode == 1) {
    if (fAllPrimes == 0) {
      pDVar4 = Cudd_zddIsop(dd,bFuncOn,bFuncOnDc,&zCover);
      Cudd_Ref(zCover);
      Cudd_Ref(pDVar4);
      Cudd_RecursiveDeref(dd,pDVar4);
      pDVar4 = zCover;
    }
    else {
      pDVar4 = Extra_zddPrimes(dd,bFuncOnDc);
      zCover = pDVar4;
      Cudd_Ref(pDVar4);
    }
    iVar1 = Abc_CountZddCubes(dd,pDVar4);
  }
  else {
    if (fMode == 0) {
      if (fAllPrimes == 0) {
        pDVar4 = Cudd_zddIsop(dd,(DdNode *)((ulong)bFuncOnDc ^ 1),(DdNode *)((ulong)bFuncOn ^ 1),
                              &zCover);
        Cudd_Ref(zCover);
        Cudd_Ref(pDVar4);
        Cudd_RecursiveDeref(dd,pDVar4);
        pDVar4 = zCover;
      }
      else {
        pDVar4 = Extra_zddPrimes(dd,(DdNode *)((ulong)bFuncOnDc ^ 1));
        zCover = pDVar4;
        Cudd_Ref(pDVar4);
      }
      iVar1 = Abc_CountZddCubes(dd,pDVar4);
      iVar2 = 0;
      goto LAB_006a22ea;
    }
    if (fMode != -1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                    ,0x133,
                    "char *Abc_ConvertBddToSop(Mem_Flex_t *, DdManager *, DdNode *, DdNode *, int, int, Vec_Str_t *, int)"
                   );
    }
    if (fAllPrimes != 0) {
      __assert_fail("fAllPrimes == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                    ,0xed,
                    "char *Abc_ConvertBddToSop(Mem_Flex_t *, DdManager *, DdNode *, DdNode *, int, int, Vec_Str_t *, int)"
                   );
    }
    pDVar4 = Cudd_zddIsop(dd,(DdNode *)((ulong)bFuncOnDc ^ 1),(DdNode *)((ulong)bFuncOn ^ 1),
                          &zCover0);
    Cudd_Ref(zCover0);
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDeref(dd,pDVar4);
    iVar1 = Abc_CountZddCubes(dd,zCover0);
    pDVar4 = Cudd_zddIsop(dd,bFuncOn,bFuncOnDc,&zCover1);
    Cudd_Ref(zCover1);
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDeref(dd,pDVar4);
    iVar2 = Abc_CountZddCubes(dd,zCover1);
    if (iVar1 < iVar2) {
      zCover = zCover0;
      Cudd_RecursiveDerefZdd(dd,zCover1);
      iVar2 = 0;
      goto LAB_006a22ea;
    }
    zCover = zCover1;
    Cudd_RecursiveDerefZdd(dd,zCover0);
    iVar1 = iVar2;
  }
  iVar2 = 1;
LAB_006a22ea:
  if (iVar1 < 0x186a1) {
    iVar1 = iVar1 * (nFanins + 3);
    iVar7 = iVar1 + 1;
    if (pMan == (Mem_Flex_t *)0x0) {
      pcVar3 = (char *)malloc((long)iVar7);
    }
    else {
      pcVar3 = Mem_FlexEntryFetch(pMan,iVar7);
    }
    pcVar3[iVar1] = '\0';
    Vec_StrGrow(vCube,nFanins);
    vCube->nSize = nFanins;
    iVar1 = nFanins;
    for (lVar6 = 0; lVar5 = (long)iVar1, lVar6 < lVar5; lVar6 = lVar6 + 1) {
      vCube->pArray[lVar6] = '-';
      iVar1 = vCube->nSize;
    }
    if (iVar1 == vCube->nCap) {
      iVar7 = 0x10;
      if (0xf < iVar1) {
        iVar7 = iVar1 * 2;
      }
      Vec_StrGrow(vCube,iVar7);
      iVar1 = vCube->nSize;
      lVar5 = (long)iVar1;
    }
    vCube->nSize = iVar1 + 1;
    vCube->pArray[lVar5] = '\0';
    Abc_ConvertZddToSop(dd,zCover,pcVar3,nFanins,vCube,iVar2);
    Cudd_RecursiveDerefZdd(dd,zCover);
  }
  else {
    Cudd_RecursiveDerefZdd(dd,zCover);
    pcVar3 = (char *)0x0;
    printf("The number of cubes exceeded the predefined limit (%d).\n",100000);
  }
  return pcVar3;
}

Assistant:

char * Abc_ConvertBddToSop( Mem_Flex_t * pMan, DdManager * dd, DdNode * bFuncOn, DdNode * bFuncOnDc, int nFanins, int fAllPrimes, Vec_Str_t * vCube, int fMode )
{
    int fVerify = 0;
    char * pSop;
    DdNode * bFuncNew, * bCover, * zCover, * zCover0, * zCover1;
    int nCubes = 0, nCubes0, nCubes1, fPhase = 0;

    assert( bFuncOn == bFuncOnDc || Cudd_bddLeq( dd, bFuncOn, bFuncOnDc ) );
    if ( Cudd_IsConstant(bFuncOn) || Cudd_IsConstant(bFuncOnDc) )
    {
        if ( pMan )
            pSop = Mem_FlexEntryFetch( pMan, nFanins + 4 );
        else
            pSop = ABC_ALLOC( char, nFanins + 4 );
        pSop[0] = ' ';
        pSop[1] = '0' + (int)(bFuncOn == Cudd_ReadOne(dd));
        pSop[2] = '\n';
        pSop[3] = '\0';
        return pSop;
    }

    if ( fMode == -1 )
    { // try both phases
        assert( fAllPrimes == 0 );

        // get the ZDD of the negative polarity
        bCover = Cudd_zddIsop( dd, Cudd_Not(bFuncOnDc), Cudd_Not(bFuncOn), &zCover0 );
        Cudd_Ref( zCover0 );
        Cudd_Ref( bCover );
        Cudd_RecursiveDeref( dd, bCover );
        nCubes0 = Abc_CountZddCubes( dd, zCover0 );

        // get the ZDD of the positive polarity
        bCover = Cudd_zddIsop( dd, bFuncOn, bFuncOnDc, &zCover1 );
        Cudd_Ref( zCover1 );
        Cudd_Ref( bCover );
        Cudd_RecursiveDeref( dd, bCover );
        nCubes1 = Abc_CountZddCubes( dd, zCover1 );

        // compare the number of cubes
        if ( nCubes1 <= nCubes0 )
        { // use positive polarity
            nCubes = nCubes1;
            zCover = zCover1;
            Cudd_RecursiveDerefZdd( dd, zCover0 );
            fPhase = 1;
        }
        else
        { // use negative polarity
            nCubes = nCubes0;
            zCover = zCover0;
            Cudd_RecursiveDerefZdd( dd, zCover1 );
            fPhase = 0;
        }
    }
    else if ( fMode == 0 )
    {
        // get the ZDD of the negative polarity
        if ( fAllPrimes )
        {
            zCover = Extra_zddPrimes( dd, Cudd_Not(bFuncOnDc) ); 
            Cudd_Ref( zCover );
        }
        else
        {
            bCover = Cudd_zddIsop( dd, Cudd_Not(bFuncOnDc), Cudd_Not(bFuncOn), &zCover );
            Cudd_Ref( zCover );
            Cudd_Ref( bCover );
            Cudd_RecursiveDeref( dd, bCover );
        }
        nCubes = Abc_CountZddCubes( dd, zCover );
        fPhase = 0;
    }
    else if ( fMode == 1 )
    {
        // get the ZDD of the positive polarity
        if ( fAllPrimes )
        {
            zCover = Extra_zddPrimes( dd, bFuncOnDc ); 
            Cudd_Ref( zCover );
        }
        else
        {
            bCover = Cudd_zddIsop( dd, bFuncOn, bFuncOnDc, &zCover );
            Cudd_Ref( zCover );
            Cudd_Ref( bCover );
            Cudd_RecursiveDeref( dd, bCover );
        }
        nCubes = Abc_CountZddCubes( dd, zCover );
        fPhase = 1;
    }
    else
    {
        assert( 0 );
    }

    if ( nCubes > ABC_MAX_CUBES )
    {
        Cudd_RecursiveDerefZdd( dd, zCover );
        printf( "The number of cubes exceeded the predefined limit (%d).\n", ABC_MAX_CUBES );
        return NULL;
    }

    // allocate memory for the cover
    if ( pMan )
        pSop = Mem_FlexEntryFetch( pMan, (nFanins + 3) * nCubes + 1 );
    else 
        pSop = ABC_ALLOC( char, (nFanins + 3) * nCubes + 1 );
    pSop[(nFanins + 3) * nCubes] = 0;
    // create the SOP
    Vec_StrFill( vCube, nFanins, '-' );
    Vec_StrPush( vCube, '\0' );
    Abc_ConvertZddToSop( dd, zCover, pSop, nFanins, vCube, fPhase );
    Cudd_RecursiveDerefZdd( dd, zCover );

    // verify
    if ( fVerify )
    {
        bFuncNew = Abc_ConvertSopToBdd( dd, pSop, NULL );  Cudd_Ref( bFuncNew );
        if ( bFuncOn == bFuncOnDc )
        {
            if ( bFuncNew != bFuncOn )
                printf( "Verification failed.\n" );
        }
        else
        {
            if ( !Cudd_bddLeq(dd, bFuncOn, bFuncNew) || !Cudd_bddLeq(dd, bFuncNew, bFuncOnDc) )
                printf( "Verification failed.\n" );
        }
        Cudd_RecursiveDeref( dd, bFuncNew );
    }
    return pSop;
}